

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynSwitch * ParseSwitch(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynSwitchCase> cases_00;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *pLVar3;
  Lexeme *end;
  SynSwitchCase *this;
  IntrusiveList<SynBase> expressions_00;
  bool local_99;
  IntrusiveList<SynBase> expressions;
  SynBase *value;
  Lexeme *pos;
  IntrusiveList<SynSwitchCase> cases;
  SynBase *pSStack_28;
  bool hadDefautltCase;
  SynBase *condition;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_switch);
  if (bVar1) {
    anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'switch\'");
    pSStack_28 = ParseAssignment(ctx);
    if (pSStack_28 == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: expression not found after \'switch(\'");
      pSStack_28 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)pSStack_28,pLVar2,pLVar3);
    }
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'switch\' statement");
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after \'switch(...)\'");
    cases.tail._7_1_ = 0;
    IntrusiveList<SynSwitchCase>::IntrusiveList((IntrusiveList<SynSwitchCase> *)&pos);
    while( true ) {
      bVar1 = ParseContext::At(ctx,lex_case);
      local_99 = true;
      if (!bVar1) {
        local_99 = ParseContext::At(ctx,lex_default);
      }
      if (local_99 == false) break;
      pLVar2 = ctx->currentLexeme;
      expressions.tail = (SynBase *)0x0;
      bVar1 = ParseContext::Consume(ctx,lex_case);
      if (bVar1) {
        if ((cases.tail._7_1_ & 1) != 0) {
          pLVar3 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report
                    (ctx,pLVar3,"ERROR: default switch case can\'t be followed by more cases");
        }
        expressions.tail = ParseAssignment(ctx);
        if (expressions.tail == (SynBase *)0x0) {
          pLVar3 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report(ctx,pLVar3,"ERROR: expression expected after \'case\'");
          expressions.tail = &ParseContext::get<SynError>(ctx)->super_SynBase;
          pLVar3 = ParseContext::Current(ctx);
          end = ParseContext::Current(ctx);
          SynError::SynError((SynError *)expressions.tail,pLVar3,end);
        }
      }
      else {
        if ((cases.tail._7_1_ & 1) != 0) {
          pLVar3 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report
                    (ctx,pLVar3,"ERROR: default switch case is already defined");
        }
        ParseContext::Skip(ctx);
        cases.tail._7_1_ = 1;
      }
      anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_colon,"ERROR: \':\' expected");
      expressions_00 = ParseExpressions(ctx);
      this = ParseContext::get<SynSwitchCase>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynSwitchCase::SynSwitchCase(this,pLVar2,pLVar3,expressions.tail,expressions_00);
      IntrusiveList<SynSwitchCase>::push_back((IntrusiveList<SynSwitchCase> *)&pos,this);
    }
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after \'switch\' statement");
    ctx_local = (ParseContext *)ParseContext::get<SynSwitch>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    cases_00.tail = cases.head;
    cases_00.head = (SynSwitchCase *)pos;
    SynSwitch::SynSwitch((SynSwitch *)ctx_local,begin,pLVar2,pSStack_28,cases_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynSwitch *)ctx_local;
}

Assistant:

SynSwitch* ParseSwitch(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_switch))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'switch'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'switch('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'switch' statement");

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after 'switch(...)'");

		bool hadDefautltCase = false;

		IntrusiveList<SynSwitchCase> cases;

		while(ctx.At(lex_case) || ctx.At(lex_default))
		{
			Lexeme *pos = ctx.currentLexeme;

			SynBase *value = NULL;

			if(ctx.Consume(lex_case))
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case can't be followed by more cases");

				value = ParseAssignment(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression expected after 'case'");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}
			else
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case is already defined");

				ctx.Skip();

				hadDefautltCase = true;
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' expected");

			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			cases.push_back(new (ctx.get<SynSwitchCase>()) SynSwitchCase(pos, ctx.Previous(), value, expressions));
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after 'switch' statement");

		return new (ctx.get<SynSwitch>()) SynSwitch(start, ctx.Previous(), condition, cases);
	}

	return NULL;
}